

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void peach::exception::
     throwFromTokenIterator<peach::exception::UndefinedTokenError,unsigned_long,unsigned_long>
               (iterator *it)

{
  int iVar1;
  UndefinedTokenError *this;
  reference puVar2;
  pointer pTVar3;
  size_t line;
  iterator *it_local;
  
  this = (UndefinedTokenError *)__cxa_allocate_exception(0x38);
  puVar2 = __gnu_cxx::
           __normal_iterator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_*,_std::vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>_>
           ::operator*(it);
  pTVar3 = std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>::
           operator->(puVar2);
  line = token::Token::getLine(pTVar3);
  puVar2 = __gnu_cxx::
           __normal_iterator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_*,_std::vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>_>
           ::operator*(it);
  pTVar3 = std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>::
           operator->(puVar2);
  iVar1 = token::Token::getLinePosition(pTVar3);
  UndefinedTokenError::UndefinedTokenError(this,line,(long)iVar1);
  __cxa_throw(this,&UndefinedTokenError::typeinfo,UndefinedTokenError::~UndefinedTokenError);
}

Assistant:

inline void throwFromTokenIterator(const std::vector<token::TokenPtr>::iterator &it)
{
    throw ExceptionT((*it)->getLine(),
                     (*it)->getLinePosition());
}